

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O1

void oonf_layer2_destination_remove(oonf_layer2_destination *l2dst)

{
  if (((l2dst->_node).list.next != (list_entity *)0x0) &&
     ((l2dst->_node).list.prev != (list_entity *)0x0)) {
    oonf_class_event(&_l2dst_class,l2dst,OONF_OBJECT_REMOVED);
    avl_remove(&l2dst->neighbor->destinations,&l2dst->_node);
    oonf_class_free(&_l2dst_class,l2dst);
    return;
  }
  return;
}

Assistant:

void
oonf_layer2_destination_remove(struct oonf_layer2_destination *l2dst) {
  if (!avl_is_node_added(&l2dst->_node)) {
    return;
  }
  oonf_class_event(&_l2dst_class, l2dst, OONF_OBJECT_REMOVED);

  avl_remove(&l2dst->neighbor->destinations, &l2dst->_node);
  oonf_class_free(&_l2dst_class, l2dst);
}